

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_utils.h
# Opt level: O2

uint InvExtGCD<unsigned_int,BitsInt<unsigned_int,32>,32,141u>(uint x)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint val;
  uint uVar9;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = x;
  if (1 < x) {
    iVar2 = BitsInt<unsigned_int,_32>::Bits(x,0x20);
    uVar6 = 0;
    uVar8 = 0x8d;
    iVar3 = 0x21;
    uVar9 = 1;
    while (x != 0) {
      bVar5 = (char)iVar3 - (char)iVar2;
      val = uVar8 ^ x << (bVar5 & 0x1f);
      uVar7 = uVar6 ^ uVar9 << (bVar5 & 0x1f);
      iVar4 = BitsInt<unsigned_int,_32>::Bits(val,iVar3 + -1);
      uVar6 = uVar7;
      uVar8 = val;
      iVar3 = iVar4;
      if (val < x) {
        uVar6 = uVar9;
        uVar8 = x;
        iVar3 = iVar2;
        uVar9 = uVar7;
        iVar2 = iVar4;
        x = val;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return uVar6;
}

Assistant:

inline I InvExtGCD(I x)
{
    if (F::IsZero(x) || F::IsOne(x)) return x;
    I t(0), newt(1);
    I r(MOD), newr = x;
    int rlen = BITS + 1, newrlen = F::Bits(newr, BITS);
    while (newr) {
        int q = rlen - newrlen;
        r ^= F::Shift(newr, q);
        t ^= F::UnsafeShift(newt, q);
        rlen = F::Bits(r, rlen - 1);
        if (r < newr) {
            F::Swap(t, newt);
            F::Swap(r, newr);
            std::swap(rlen, newrlen);
        }
    }
    return t;
}